

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O0

XML_Char * xlsxioread_sheet_next_cell(xlsxioreadersheet sheethandle)

{
  XML_Status XVar1;
  XML_Char *result;
  xlsxioreadersheet sheethandle_local;
  
  if (sheethandle == (xlsxioreadersheet)0x0) {
    sheethandle_local = (xlsxioreadersheet)0x0;
  }
  else if (((((sheethandle->processcallbackdata).flags & 2) == 0) && (sheethandle->paddingcol != 0))
          || ((((sheethandle->processcallbackdata).flags & 1) == 0 && (sheethandle->paddingrow != 0)
              ))) {
    if (((sheethandle->processcallbackdata).cols < sheethandle->paddingcol) ||
       (((sheethandle->processcallbackdata).flags & 2) != 0)) {
      sheethandle->paddingcol = 0;
      if (sheethandle->paddingrow != 0) {
        sheethandle->lastrownr = sheethandle->lastrownr + 1;
        sheethandle->paddingrow = sheethandle->paddingrow + 1;
        if (sheethandle->paddingrow + 1 < (sheethandle->processcallbackdata).rownr) {
          sheethandle->paddingcol = 1;
        }
      }
      sheethandle_local = (xlsxioreadersheet)0x0;
    }
    else if (((((sheethandle->processcallbackdata).flags & 4) == 0) ||
             ((sheethandle->processcallbackdata).cols == 0)) ||
            (sheethandle->lastcolnr < (sheethandle->processcallbackdata).cols)) {
      sheethandle->paddingcol = sheethandle->paddingcol + 1;
      sheethandle->lastcolnr = sheethandle->lastcolnr + 1;
      sheethandle_local = (xlsxioreadersheet)strdup("");
    }
    else {
      sheethandle_local = (xlsxioreadersheet)0x0;
    }
  }
  else if (((((sheethandle->processcallbackdata).flags & 4) == 0) ||
           ((sheethandle->processcallbackdata).cols == 0)) ||
          (sheethandle->lastcolnr < (sheethandle->processcallbackdata).cols)) {
    if (((sheethandle->processcallbackdata).celldata == (XML_Char *)0x0) &&
       (XVar1 = expat_process_zip_file_resume
                          (sheethandle->zipfile,(sheethandle->processcallbackdata).xmlparser),
       XVar1 != XML_STATUS_SUSPENDED)) {
      (sheethandle->processcallbackdata).celldata = (XML_Char *)0x0;
    }
    if ((((sheethandle->processcallbackdata).flags & 1) == 0) &&
       (sheethandle->lastrownr + 1 < (sheethandle->processcallbackdata).rownr)) {
      sheethandle->paddingrow = sheethandle->lastrownr + 1;
      sheethandle->paddingcol = 1;
      sheethandle_local = (xlsxioreadersheet)xlsxioread_sheet_next_cell(sheethandle);
    }
    else if ((((sheethandle->processcallbackdata).flags & 2) == 0) &&
            (sheethandle->lastcolnr + 1 < (sheethandle->processcallbackdata).colnr)) {
      sheethandle->lastcolnr = sheethandle->lastcolnr + 1;
      sheethandle_local = (xlsxioreadersheet)strdup("");
    }
    else {
      sheethandle_local = (xlsxioreadersheet)(sheethandle->processcallbackdata).celldata;
      (sheethandle->processcallbackdata).celldata = (XML_Char *)0x0;
      if (((sheethandle_local == (xlsxioreadersheet)0x0) &&
          (sheethandle->lastrownr = (sheethandle->processcallbackdata).rownr,
          ((sheethandle->processcallbackdata).flags & 2) == 0)) &&
         ((sheethandle->processcallbackdata).colnr < (sheethandle->processcallbackdata).cols)) {
        sheethandle->paddingcol = sheethandle->lastcolnr + 1;
        sheethandle_local = (xlsxioreadersheet)xlsxioread_sheet_next_cell(sheethandle);
      }
      else {
        sheethandle->lastcolnr = (sheethandle->processcallbackdata).colnr;
      }
    }
  }
  else {
    sheethandle_local = (xlsxioreadersheet)0x0;
  }
  return (XML_Char *)sheethandle_local;
}

Assistant:

DLL_EXPORT_XLSXIO XLSXIOCHAR* xlsxioread_sheet_next_cell (xlsxioreadersheet sheethandle)
{
  XML_Char* result;
  if (!sheethandle)
    return NULL;
  //if (!(sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_CELLS) && sheethandle->paddingcol) {
  if ((!(sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_CELLS) && sheethandle->paddingcol) || (!(sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_ROWS) && sheethandle->paddingrow)) {
    if ((/*sheethandle->processcallbackdata.cols > 0 &&*/ sheethandle->paddingcol > sheethandle->processcallbackdata.cols) || (sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_CELLS)) {
      //last empty column added, finish row
      sheethandle->paddingcol = 0;
      //when padding rows prepare for the next one
      if (sheethandle->paddingrow) {
        sheethandle->lastrownr++;
        sheethandle->paddingrow++;
        if (sheethandle->paddingrow + 1 < sheethandle->processcallbackdata.rownr) {
          sheethandle->paddingcol = 1;
        }
      }
      return NULL;
    } else if ((sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EXTRA_CELLS) && sheethandle->processcallbackdata.cols > 0 && sheethandle->lastcolnr >= sheethandle->processcallbackdata.cols) {
      //end of line when out of bounds
      return NULL;
    } else {
      //add another empty column
      sheethandle->paddingcol++;
      sheethandle->lastcolnr++;
      return XML_Char_dup(X(""));
    }
  } else if ((sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EXTRA_CELLS) && sheethandle->processcallbackdata.cols > 0 && sheethandle->lastcolnr >= sheethandle->processcallbackdata.cols) {
    //end of line when out of bounds
    return NULL;
  }
  //get value
  if (!sheethandle->processcallbackdata.celldata)
    if (expat_process_zip_file_resume(sheethandle->zipfile, sheethandle->processcallbackdata.xmlparser) != XML_STATUS_SUSPENDED)
      sheethandle->processcallbackdata.celldata = NULL;
  //insert empty rows if needed
  if (!(sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_ROWS) && sheethandle->lastrownr + 1 < sheethandle->processcallbackdata.rownr) {
    sheethandle->paddingrow = sheethandle->lastrownr + 1;
    sheethandle->paddingcol = sheethandle->processcallbackdata.colnr*0 + 1;
    return xlsxioread_sheet_next_cell(sheethandle);
  }
  //insert empty column before if needed
  if (!(sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_CELLS)) {
    if (sheethandle->lastcolnr + 1 < sheethandle->processcallbackdata.colnr) {
      if (0) {
      //if ((sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EXTRA_CELLS) && sheethandle->processcallbackdata.cols > 0 && sheethandle->lastcolnr >= sheethandle->processcallbackdata.cols) {
        //end of line when out of bounds
        return NULL;
      } else {
        sheethandle->lastcolnr++;
        return XML_Char_dup(X(""));
      }
    }
  }
  result = sheethandle->processcallbackdata.celldata;
  sheethandle->processcallbackdata.celldata = NULL;
  //end of row
  if (!result) {
    sheethandle->lastrownr = sheethandle->processcallbackdata.rownr;
    //insert empty column at end of row if needed
    if (!(sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_CELLS) && sheethandle->processcallbackdata.colnr < sheethandle->processcallbackdata.cols) {
      sheethandle->paddingcol = sheethandle->lastcolnr + 1;
      return xlsxioread_sheet_next_cell(sheethandle);
    }
  }
  sheethandle->lastcolnr = sheethandle->processcallbackdata.colnr;
  return result;
}